

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbedTexturesProcess.cpp
# Opt level: O3

void __thiscall Assimp::EmbedTexturesProcess::~EmbedTexturesProcess(EmbedTexturesProcess *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__EmbedTexturesProcess_007ddcb8;
  pcVar2 = (this->mRootPath)._M_dataplus._M_p;
  paVar1 = &(this->mRootPath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  BaseProcess::~BaseProcess(&this->super_BaseProcess);
  return;
}

Assistant:

EmbedTexturesProcess::~EmbedTexturesProcess() {
}